

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeRun(JunitReporter *this,TestRunNode *testRunNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  ScopedElement *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *testCaseNode;
  _anonymous_namespace_ *this_00;
  StringRef SVar4;
  StringRef attribute;
  string local_3a8;
  StringRef local_388;
  allocator<char> local_371;
  string local_370 [32];
  undefined1 local_350 [16];
  string local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_320;
  allocator<char> local_309;
  string local_308 [32];
  undefined1 local_2e8 [24];
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  allocator<char> local_281;
  string local_280 [32];
  undefined1 local_260 [40];
  StringRef local_238;
  StringRef local_228;
  allocator<char> local_211;
  string local_210 [32];
  undefined1 local_1f0 [24];
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  ScopedElement properties;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_188;
  StringRef local_178;
  string local_168;
  StringRef local_148;
  StringRef local_138;
  StringRef local_128;
  StringRef local_118;
  StringRef local_108;
  StringRef local_f8;
  uint64_t local_e8;
  StringRef local_e0;
  StringRef local_d0;
  unsigned_long local_c0;
  StringRef local_b8;
  StringRef local_a8;
  char *local_98;
  size_type sStack_90;
  StringRef local_80;
  TestRunNode *local_70;
  TestRunStats *stats;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ScopedElement e;
  double suiteTime_local;
  TestRunNode *testRunNode_local;
  JunitReporter *this_local;
  
  e._8_8_ = suiteTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"testsuite",&local_51);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->xml,(XmlFormatting)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70 = testRunNode;
  local_80 = operator____sr("name",4);
  local_98 = (local_70->value).runInfo.name.m_start;
  sStack_90 = (local_70->value).runInfo.name.m_size;
  XmlWriter::writeAttribute(&this->xml,local_80,(local_70->value).runInfo.name);
  local_a8 = operator____sr("errors",6);
  XmlWriter::writeAttribute<unsigned_int,void>(&this->xml,local_a8,&this->unexpectedExceptions);
  local_b8 = operator____sr("failures",8);
  local_c0 = (local_70->value).totals.assertions.failed - (ulong)this->unexpectedExceptions;
  XmlWriter::writeAttribute<unsigned_long,void>(&this->xml,local_b8,&local_c0);
  local_d0 = operator____sr("skipped",7);
  XmlWriter::writeAttribute<unsigned_long,void>
            (&this->xml,local_d0,&(local_70->value).totals.assertions.skipped);
  local_e0 = operator____sr("tests",5);
  local_e8 = Counts::total(&(local_70->value).totals.assertions);
  XmlWriter::writeAttribute<unsigned_long,void>(&this->xml,local_e0,&local_e8);
  local_f8 = operator____sr("hostname",8);
  local_108 = operator____sr("tbd",3);
  XmlWriter::writeAttribute(&this->xml,local_f8,local_108);
  iVar2 = (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config)
            ->_vptr_IConfig[0xb])();
  if (iVar2 == 2) {
    local_118 = operator____sr("time",4);
    local_128 = operator____sr("",0);
    XmlWriter::writeAttribute(&this->xml,local_118,local_128);
  }
  else {
    this_00 = (_anonymous_namespace_ *)0x4;
    local_138 = operator____sr("time",4);
    (anonymous_namespace)::formatDuration_abi_cxx11_(&local_168,this_00,(double)e._8_8_);
    StringRef::StringRef(&local_148,&local_168);
    XmlWriter::writeAttribute(&this->xml,local_138,local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  local_178 = operator____sr("timestamp",9);
  (anonymous_namespace)::getCurrentTimestamp_abi_cxx11_();
  StringRef::StringRef((StringRef *)&local_188,(string *)&properties.m_fmt);
  XmlWriter::writeAttribute(&this->xml,local_178,(StringRef)local_188);
  std::__cxx11::string::~string((string *)&properties.m_fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"properties",(allocator<char> *)(local_1f0 + 0x17));
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_1b8,(string *)&this->xml,(XmlFormatting)local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1f0 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_210,"property",&local_211);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_1f0,(string *)&this->xml,(XmlFormatting)local_210);
  local_228 = operator____sr("name",4);
  local_238 = operator____sr("random-seed",0xb);
  pSVar3 = XmlWriter::ScopedElement::writeAttribute((ScopedElement *)local_1f0,local_228,local_238);
  local_260._24_16_ = (undefined1  [16])operator____sr("value",5);
  local_260._20_4_ =
       (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config)->
         _vptr_IConfig[0x11])();
  XmlWriter::ScopedElement::writeAttribute<unsigned_int,void>
            (pSVar3,(StringRef)local_260._24_16_,(uint *)(local_260 + 0x14));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1f0);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  iVar2 = (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config)
            ->_vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_280,"property",&local_281);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_260,(string *)&this->xml,(XmlFormatting)local_280);
    SVar4 = operator____sr("name",4);
    attribute = operator____sr("filters",7);
    pSVar3 = XmlWriter::ScopedElement::writeAttribute((ScopedElement *)local_260,SVar4,attribute);
    SVar4 = operator____sr("value",5);
    iVar2 = (*((this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config
              )->_vptr_IConfig[0xd])();
    XmlWriter::ScopedElement::writeAttribute<Catch::TestSpec,void>
              (pSVar3,SVar4,(TestSpec *)CONCAT44(extraout_var_00,iVar2));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_260);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1b8);
  __end1 = std::
           vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ::begin(&testRunNode->children);
  child = (unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
           *)std::
             vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
             ::end(&testRunNode->children);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                                     *)&child), bVar1) {
    local_2e8._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
         ::operator*(&__end1);
    testCaseNode = Detail::
                   unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
                   ::operator*((unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
                                *)local_2e8._16_8_);
    writeTestCase(this,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_308,"system-out",&local_309);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_2e8,(string *)&this->xml,(XmlFormatting)local_308);
  trim((string *)(local_350 + 0x10),&this->stdOutForSuite);
  StringRef::StringRef((StringRef *)&local_320,(string *)(local_350 + 0x10));
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_2e8,(StringRef)local_320,Newline);
  std::__cxx11::string::~string((string *)(local_350 + 0x10));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2e8);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"system-err",&local_371);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_350,(string *)&this->xml,(XmlFormatting)local_370);
  trim(&local_3a8,&this->stdErrForSuite);
  StringRef::StringRef(&local_388,&local_3a8);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_350,local_388,Newline);
  std::__cxx11::string::~string((string *)&local_3a8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_350);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  return;
}

Assistant:

void JunitReporter::writeRun( TestRunNode const& testRunNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestRunStats const& stats = testRunNode.value;
        xml.writeAttribute( "name"_sr, stats.runInfo.name );
        xml.writeAttribute( "errors"_sr, unexpectedExceptions );
        xml.writeAttribute( "failures"_sr, stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "skipped"_sr, stats.totals.assertions.skipped );
        xml.writeAttribute( "tests"_sr, stats.totals.assertions.total() );
        xml.writeAttribute( "hostname"_sr, "tbd"_sr ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time"_sr, ""_sr );
        else
            xml.writeAttribute( "time"_sr, formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp"_sr, getCurrentTimestamp() );

        // Write properties
        {
            auto properties = xml.scopedElement("properties");
            xml.scopedElement("property")
                .writeAttribute("name"_sr, "random-seed"_sr)
                .writeAttribute("value"_sr, m_config->rngSeed());
            if (m_config->testSpec().hasFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name"_sr, "filters"_sr)
                    .writeAttribute("value"_sr, m_config->testSpec());
            }
        }

        // Write test cases
        for( auto const& child : testRunNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }